

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O0

void __thiscall
PcodeGenerator::CallReplace
          (PcodeGenerator *this,iterator *iter_call,string *top_label,string *bottom_label,
          int argument_number)

{
  bool bVar1;
  __type _Var2;
  PcodeType PVar3;
  reference __k;
  pointer pPVar4;
  char *__nptr;
  mapped_type *pmVar5;
  iterator __first;
  iterator __last;
  const_iterator local_4a8;
  PcodeType local_49c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_498;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_490;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_488;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_480;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_478;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_470;
  PcodeType local_464;
  undefined1 local_460 [4];
  PcodeType op_4;
  string num3_3;
  string num2_3;
  string num1_4;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_3f8;
  iterator iter_5;
  int local_3e0;
  allocator local_3d9;
  string local_3d8;
  string local_3b8;
  PcodeType local_394;
  undefined1 local_390 [8];
  string temp_name;
  undefined1 local_368 [4];
  int value;
  string num3_2;
  string num2_2;
  string num1_3;
  iterator iStack_300;
  PcodeType op_3;
  undefined1 local_2f8 [8];
  string func_name;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> _Stack_2d0;
  int count;
  iterator iter_4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  para_map;
  undefined1 local_288 [4];
  PcodeType op_2;
  string num3_1;
  string num2_1;
  string num1_2;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_220;
  iterator iter_3;
  string new_temp;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  iterator iter_2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  temp_map;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  const_iterator local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_190;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_188;
  const_iterator local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  Pcode *local_168;
  const_iterator local_160;
  Pcode *local_158;
  PcodeType local_14c;
  undefined1 local_148 [4];
  PcodeType op_1;
  string num3;
  string num2;
  string num1_1;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_e0;
  iterator iter_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp_vector;
  allocator<Pcode> local_a9;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_a8;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_a0;
  undefined1 local_98 [8];
  vector<Pcode,_std::allocator<Pcode>_> origin;
  undefined1 local_78 [8];
  string num1;
  iterator iStack_50;
  PcodeType op;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_48;
  iterator iter;
  iterator iter_bottom;
  iterator iter_top;
  int argument_number_local;
  string *bottom_label_local;
  string *top_label_local;
  iterator *iter_call_local;
  PcodeGenerator *this_local;
  
  __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
  __normal_iterator(&iter_bottom);
  __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
  __normal_iterator(&iter);
  local_48._M_current =
       (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::begin(&this->m_pcode_queue);
  while( true ) {
    iStack_50 = std::vector<Pcode,_std::allocator<Pcode>_>::end(&this->m_pcode_queue);
    bVar1 = __gnu_cxx::operator!=(&local_48,&stack0xffffffffffffffb0);
    if (!bVar1) break;
    pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
             operator->(&local_48);
    num1.field_2._12_4_ = Pcode::GetOP(pPVar4);
    pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
             operator->(&local_48);
    Pcode::GetNum1_abi_cxx11_((string *)local_78,pPVar4);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,top_label);
    if ((_Var2) && (num1.field_2._12_4_ == 0xc)) {
      iter_bottom._M_current = local_48._M_current;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,bottom_label);
    if ((_Var2) && (num1.field_2._12_4_ == 0xc)) {
      iter._M_current = local_48._M_current;
    }
    std::__cxx11::string::~string((string *)local_78);
    __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::operator++
              (&local_48);
  }
  origin.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)__gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                operator++(&iter_bottom,0);
  local_a0._M_current = iter_bottom._M_current;
  local_a8._M_current = iter._M_current;
  std::allocator<Pcode>::allocator(&local_a9);
  std::vector<Pcode,std::allocator<Pcode>>::
  vector<__gnu_cxx::__normal_iterator<Pcode*,std::vector<Pcode,std::allocator<Pcode>>>,void>
            ((vector<Pcode,std::allocator<Pcode>> *)local_98,local_a0,local_a8,&local_a9);
  std::allocator<Pcode>::~allocator(&local_a9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&iter_1);
  local_e0._M_current =
       (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::begin
                          ((vector<Pcode,_std::allocator<Pcode>_> *)local_98);
  while( true ) {
    num1_1.field_2._8_8_ =
         std::vector<Pcode,_std::allocator<Pcode>_>::end
                   ((vector<Pcode,_std::allocator<Pcode>_> *)local_98);
    bVar1 = __gnu_cxx::operator!=
                      (&local_e0,
                       (__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> *)
                       ((long)&num1_1.field_2 + 8));
    if (!bVar1) break;
    pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
             operator->(&local_e0);
    Pcode::GetNum1_abi_cxx11_((string *)((long)&num2.field_2 + 8),pPVar4);
    pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
             operator->(&local_e0);
    Pcode::GetNum2_abi_cxx11_((string *)((long)&num3.field_2 + 8),pPVar4);
    pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
             operator->(&local_e0);
    Pcode::GetNum3_abi_cxx11_((string *)local_148,pPVar4);
    pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
             operator->(&local_e0);
    local_14c = Pcode::GetOP(pPVar4);
    bVar1 = IsTempName((string *)((long)&num2.field_2 + 8));
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&iter_1,(value_type *)((long)&num2.field_2 + 8));
    }
    bVar1 = IsTempName((string *)((long)&num3.field_2 + 8));
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&iter_1,(value_type *)((long)&num3.field_2 + 8));
    }
    bVar1 = IsTempName((string *)local_148);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&iter_1,(value_type *)local_148);
    }
    if ((local_14c == JUMP) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&num2.field_2 + 8),"RA"), bVar1)) {
      __gnu_cxx::__normal_iterator<Pcode_const*,std::vector<Pcode,std::allocator<Pcode>>>::
      __normal_iterator<Pcode*>
                ((__normal_iterator<Pcode_const*,std::vector<Pcode,std::allocator<Pcode>>> *)
                 &local_160,&local_e0);
      local_158 = (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::erase
                                     ((vector<Pcode,_std::allocator<Pcode>_> *)local_98,local_160);
      local_e0._M_current = local_158;
      local_168 = (Pcode *)__gnu_cxx::
                           __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                           operator--(&local_e0,0);
    }
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string((string *)(num3.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(num2.field_2._M_local_buf + 8));
    __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::operator++
              (&local_e0);
  }
  local_170._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&iter_1);
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&iter_1);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (local_170,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_178);
  local_190._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&iter_1);
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&iter_1);
  local_188 = std::
              unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        (local_190,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_198);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_180,&local_188);
  local_1a8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&iter_1);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_1a0,&local_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&iter_1,local_180,local_1a0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&iter_2);
  local_1f0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&iter_1);
  while( true ) {
    new_temp.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&iter_1);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1f0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&new_temp.field_2 + 8));
    if (!bVar1) break;
    GetNextTemp_abi_cxx11_((string *)&iter_3,this);
    __k = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&local_1f0);
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&iter_2,__k);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&iter_3);
    std::__cxx11::string::~string((string *)&iter_3);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_1f0);
  }
  local_220._M_current =
       (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::begin
                          ((vector<Pcode,_std::allocator<Pcode>_> *)local_98);
  while( true ) {
    num1_2.field_2._8_8_ =
         std::vector<Pcode,_std::allocator<Pcode>_>::end
                   ((vector<Pcode,_std::allocator<Pcode>_> *)local_98);
    bVar1 = __gnu_cxx::operator!=
                      (&local_220,
                       (__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> *)
                       ((long)&num1_2.field_2 + 8));
    if (!bVar1) break;
    pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
             operator->(&local_220);
    Pcode::GetNum1_abi_cxx11_((string *)((long)&num2_1.field_2 + 8),pPVar4);
    pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
             operator->(&local_220);
    Pcode::GetNum2_abi_cxx11_((string *)((long)&num3_1.field_2 + 8),pPVar4);
    pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
             operator->(&local_220);
    Pcode::GetNum3_abi_cxx11_((string *)local_288,pPVar4);
    pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
             operator->(&local_220);
    Pcode::GetOP(pPVar4);
    bVar1 = IsTempName((string *)((long)&num2_1.field_2 + 8));
    if (bVar1) {
      pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
               operator->(&local_220);
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&iter_2,(key_type *)((long)&num2_1.field_2 + 8));
      Pcode::SetNum1(pPVar4,pmVar5);
    }
    bVar1 = IsTempName((string *)((long)&num3_1.field_2 + 8));
    if (bVar1) {
      pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
               operator->(&local_220);
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&iter_2,(key_type *)((long)&num3_1.field_2 + 8));
      Pcode::SetNum2(pPVar4,pmVar5);
    }
    bVar1 = IsTempName((string *)local_288);
    if (bVar1) {
      pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
               operator->(&local_220);
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&iter_2,(key_type *)local_288);
      Pcode::SetNum3(pPVar4,pmVar5);
    }
    std::__cxx11::string::~string((string *)local_288);
    std::__cxx11::string::~string((string *)(num3_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(num2_1.field_2._M_local_buf + 8));
    __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::operator++
              (&local_220);
  }
  if (argument_number != 0) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&iter_4);
    _Stack_2d0._M_current = iter_call->_M_current;
    func_name.field_2._12_4_ = 0;
    pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
             operator->(iter_call);
    Pcode::GetNum3_abi_cxx11_((string *)local_2f8,pPVar4);
    while( true ) {
      iStack_300 = std::vector<Pcode,_std::allocator<Pcode>_>::begin(&this->m_pcode_queue);
      bVar1 = __gnu_cxx::operator!=(&stack0xfffffffffffffd30,&stack0xfffffffffffffd00);
      if (!bVar1) break;
      pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
               operator->(&stack0xfffffffffffffd30);
      PVar3 = Pcode::GetOP(pPVar4);
      pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
               operator->(&stack0xfffffffffffffd30);
      Pcode::GetNum1_abi_cxx11_((string *)((long)&num2_2.field_2 + 8),pPVar4);
      pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
               operator->(&stack0xfffffffffffffd30);
      Pcode::GetNum2_abi_cxx11_((string *)((long)&num3_2.field_2 + 8),pPVar4);
      pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
               operator->(&stack0xfffffffffffffd30);
      Pcode::GetNum3_abi_cxx11_((string *)local_368,pPVar4);
      if ((PVar3 == PARA) &&
         (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_368,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2f8), _Var2)) {
        __nptr = (char *)std::__cxx11::string::c_str();
        temp_name.field_2._12_4_ = atoi(__nptr);
        if (temp_name.field_2._12_4_ == 0) {
          pmVar5 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&iter_4,(key_type *)((long)&num2_2.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)pmVar5,(string *)(num3_2.field_2._M_local_buf + 8));
          pPVar4 = __gnu_cxx::
                   __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                   operator->(&stack0xfffffffffffffd30);
          temp_name.field_2._8_4_ = 0x15;
          Pcode::SetOP(pPVar4,(PcodeType *)(temp_name.field_2._M_local_buf + 8));
        }
        else {
          GetNextTemp_abi_cxx11_((string *)local_390,this);
          pPVar4 = __gnu_cxx::
                   __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                   operator->(&stack0xfffffffffffffd30);
          local_394 = ASSIGN;
          Pcode::SetOP(pPVar4,&local_394);
          pPVar4 = __gnu_cxx::
                   __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                   operator->(&stack0xfffffffffffffd30);
          Pcode::SetNum1(pPVar4,(string *)local_390);
          pPVar4 = __gnu_cxx::
                   __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                   operator->(&stack0xfffffffffffffd30);
          std::__cxx11::to_string(&local_3b8,temp_name.field_2._12_4_);
          Pcode::SetNum2(pPVar4,&local_3b8);
          std::__cxx11::string::~string((string *)&local_3b8);
          pPVar4 = __gnu_cxx::
                   __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                   operator->(&stack0xfffffffffffffd30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3d8,"",&local_3d9);
          Pcode::SetNum3(pPVar4,&local_3d8);
          std::__cxx11::string::~string((string *)&local_3d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
          pmVar5 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&iter_4,(key_type *)((long)&num2_2.field_2 + 8));
          std::__cxx11::string::operator=((string *)pmVar5,(string *)local_390);
          std::__cxx11::string::~string((string *)local_390);
        }
        func_name.field_2._12_4_ = func_name.field_2._12_4_ + 1;
        if (func_name.field_2._12_4_ != argument_number) goto LAB_0019947b;
        local_3e0 = 0xe;
      }
      else {
LAB_0019947b:
        local_3e0 = 0;
      }
      std::__cxx11::string::~string((string *)local_368);
      std::__cxx11::string::~string((string *)(num3_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(num2_2.field_2._M_local_buf + 8));
      if (local_3e0 != 0) break;
      __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::operator--
                (&stack0xfffffffffffffd30,0);
    }
    iter_5 = std::vector<Pcode,_std::allocator<Pcode>_>::begin(&this->m_pcode_queue);
    bVar1 = __gnu_cxx::operator==(&stack0xfffffffffffffd30,&iter_5);
    if (bVar1) {
      fprintf(_stderr,"no enough argument\n");
      bVar1 = true;
    }
    else {
      local_3f8._M_current =
           (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::begin
                              ((vector<Pcode,_std::allocator<Pcode>_> *)local_98);
      while( true ) {
        num1_4.field_2._8_8_ =
             std::vector<Pcode,_std::allocator<Pcode>_>::end
                       ((vector<Pcode,_std::allocator<Pcode>_> *)local_98);
        bVar1 = __gnu_cxx::operator!=
                          (&local_3f8,
                           (__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>
                            *)((long)&num1_4.field_2 + 8));
        if (!bVar1) break;
        pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>
                 ::operator->(&local_3f8);
        Pcode::GetNum1_abi_cxx11_((string *)((long)&num2_3.field_2 + 8),pPVar4);
        pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>
                 ::operator->(&local_3f8);
        Pcode::GetNum2_abi_cxx11_((string *)((long)&num3_3.field_2 + 8),pPVar4);
        pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>
                 ::operator->(&local_3f8);
        Pcode::GetNum3_abi_cxx11_((string *)local_460,pPVar4);
        pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>
                 ::operator->(&local_3f8);
        local_464 = Pcode::GetOP(pPVar4);
        local_470._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&iter_4,(key_type *)((long)&num2_3.field_2 + 8));
        local_478._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&iter_4);
        bVar1 = std::__detail::operator!=(&local_470,&local_478);
        if (bVar1) {
          pPVar4 = __gnu_cxx::
                   __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                   operator->(&local_3f8);
          pmVar5 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&iter_4,(key_type *)((long)&num2_3.field_2 + 8));
          Pcode::SetNum1(pPVar4,pmVar5);
        }
        local_480._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&iter_4,(key_type *)((long)&num3_3.field_2 + 8));
        local_488._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&iter_4);
        bVar1 = std::__detail::operator!=(&local_480,&local_488);
        if (bVar1) {
          pPVar4 = __gnu_cxx::
                   __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                   operator->(&local_3f8);
          pmVar5 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&iter_4,(key_type *)((long)&num3_3.field_2 + 8));
          Pcode::SetNum2(pPVar4,pmVar5);
        }
        local_490._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&iter_4,(key_type *)local_460);
        local_498._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&iter_4);
        bVar1 = std::__detail::operator!=(&local_490,&local_498);
        if (bVar1) {
          pPVar4 = __gnu_cxx::
                   __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
                   operator->(&local_3f8);
          pmVar5 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&iter_4,(key_type *)local_460);
          Pcode::SetNum3(pPVar4,pmVar5);
        }
        std::__cxx11::string::~string((string *)local_460);
        std::__cxx11::string::~string((string *)(num3_3.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(num2_3.field_2._M_local_buf + 8));
        __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
        operator++(&local_3f8);
      }
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)local_2f8);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&iter_4);
    if (bVar1) goto LAB_00199991;
  }
  pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
           operator->(iter_call);
  local_49c = NOP;
  Pcode::SetOP(pPVar4,&local_49c);
  __gnu_cxx::__normal_iterator<Pcode_const*,std::vector<Pcode,std::allocator<Pcode>>>::
  __normal_iterator<Pcode*>
            ((__normal_iterator<Pcode_const*,std::vector<Pcode,std::allocator<Pcode>>> *)&local_4a8,
             iter_call);
  __first = std::vector<Pcode,_std::allocator<Pcode>_>::begin
                      ((vector<Pcode,_std::allocator<Pcode>_> *)local_98);
  __last = std::vector<Pcode,_std::allocator<Pcode>_>::end
                     ((vector<Pcode,_std::allocator<Pcode>_> *)local_98);
  std::vector<Pcode,std::allocator<Pcode>>::
  insert<__gnu_cxx::__normal_iterator<Pcode*,std::vector<Pcode,std::allocator<Pcode>>>,void>
            ((vector<Pcode,std::allocator<Pcode>> *)&this->m_pcode_queue,local_4a8,
             (__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>)
             __first._M_current,
             (__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>)
             __last._M_current);
LAB_00199991:
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&iter_2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&iter_1);
  std::vector<Pcode,_std::allocator<Pcode>_>::~vector
            ((vector<Pcode,_std::allocator<Pcode>_> *)local_98);
  return;
}

Assistant:

void PcodeGenerator::CallReplace(const vector<Pcode>::iterator& iter_call, const string& top_label, const string& bottom_label, int argument_number) {
    vector<Pcode>::iterator iter_top;
    vector<Pcode>::iterator iter_bottom;
    for (auto iter=m_pcode_queue.begin(); iter != m_pcode_queue.end(); ++iter) {
        PcodeType op = iter->GetOP();
        string num1 = iter->GetNum1();
        if (num1 == top_label && op == LABEL)
            iter_top = iter;
        if (num1 == bottom_label && op == LABEL)
            iter_bottom = iter;
    }
    iter_top++;
    vector<Pcode> origin(iter_top, iter_bottom);
    // replace temp
    vector<string> temp_vector;
    for (auto iter=origin.begin(); iter != origin.end(); ++iter) {
        string num1 = iter->GetNum1();
        string num2 = iter->GetNum2();
        string num3 = iter->GetNum3();
        PcodeType op = iter->GetOP();
        if (IsTempName(num1)) {
            temp_vector.push_back(num1);
        }
        if (IsTempName(num2)) {
            temp_vector.push_back(num2);
        }
        if (IsTempName(num3)) {
            temp_vector.push_back(num3);
        }
        
        if (op == JUMP && num1 == "RA") {  // remove JUMP RA
            iter = origin.erase(iter);
            iter--;
        }
    }
    sort(temp_vector.begin(), temp_vector.end());
    temp_vector.erase(unique(temp_vector.begin(), temp_vector.end()), temp_vector.end());
    unordered_map<string, string> temp_map;
    for (auto iter=temp_vector.begin(); iter != temp_vector.end(); ++iter) {
        string new_temp = this->GetNextTemp();
        temp_map[*iter] = new_temp;
    }
    for (auto iter=origin.begin(); iter != origin.end(); ++iter) {
        string num1 = iter->GetNum1();
        string num2 = iter->GetNum2();
        string num3 = iter->GetNum3();
        PcodeType op = iter->GetOP();
        if (IsTempName(num1)) {
            //printf("%s---%s\n", num1.c_str(), temp_map[num1].c_str());
            iter->SetNum1(temp_map[num1]);
        }
        if (IsTempName(num2)) {
            //printf("%s---%s\n", num2.c_str(), temp_map[num2].c_str());
            iter->SetNum2(temp_map[num2]);
        }
        if (IsTempName(num3)) {
            //printf("%s---%s\n", num3.c_str(), temp_map[num3].c_str());
            iter->SetNum3(temp_map[num3]);
        }
    }
    // replace argument
    if (argument_number != 0) {
        unordered_map<string, string> para_map;
        auto iter = iter_call;
        int count = 0;
        string func_name = iter_call->GetNum3();
        for (; iter != m_pcode_queue.begin(); iter--) {
            PcodeType op = iter->GetOP();
            string num1 = iter->GetNum1();
            string num2 = iter->GetNum2();
            string num3 = iter->GetNum3();
            if (op == PARA && num3 == func_name) {
                int value = atoi(num2.c_str());
                if (value == 0) {
                    para_map[num1] = num2;
                    iter->SetOP(NOP);
                } else {
                    string temp_name = this->GetNextTemp();
                    //Pcode pcode(ASSIGN, temp_name, std::to_string(value), EMPTY_STR);
                    //iter = m_pcode_queue.insert(iter, pcode);
                    //iter--;
                    iter->SetOP(ASSIGN);
                    iter->SetNum1(temp_name);
                    iter->SetNum2(std::to_string(value));
                    iter->SetNum3(EMPTY_STR);
                    para_map[num1] = temp_name;
                }
                count++;
                if (count == argument_number) {
                    break;
                }
            }
        }
        if (iter == m_pcode_queue.begin()) {
            fprintf(stderr, "no enough argument\n");
            return;
        }
        for (auto iter=origin.begin(); iter != origin.end(); ++iter) {
            string num1 = iter->GetNum1();
            string num2 = iter->GetNum2();
            string num3 = iter->GetNum3();
            PcodeType op = iter->GetOP();
            if (para_map.find(num1) != para_map.end()) {
                iter->SetNum1(para_map[num1]);
            }
            if (para_map.find(num2) != para_map.end()) {
                iter->SetNum2(para_map[num2]);
            }
            if (para_map.find(num3) != para_map.end()) {
                iter->SetNum3(para_map[num3]);
            }
        }
    }
    // insert
    iter_call->SetOP(NOP);
    //printf("insert begin%d\n", m_pcode_queue.size());
    m_pcode_queue.insert(iter_call, origin.begin(), origin.end());
    //printf("insert end%d\n", m_pcode_queue.size());
}